

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_callWithObjectParameterEqualComparisonButFailsWithoutComparator_Test::
TEST_MockExpectedCall_callWithObjectParameterEqualComparisonButFailsWithoutComparator_Test
          (TEST_MockExpectedCall_callWithObjectParameterEqualComparisonButFailsWithoutComparator_Test
           *this)

{
  TEST_MockExpectedCall_callWithObjectParameterEqualComparisonButFailsWithoutComparator_Test
  *this_local;
  
  memset(this,0,0x18);
  TEST_GROUP_CppUTestGroupMockExpectedCall::TEST_GROUP_CppUTestGroupMockExpectedCall
            (&this->super_TEST_GROUP_CppUTestGroupMockExpectedCall);
  (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).super_Utest._vptr_Utest =
       (_func_int **)
       &
       PTR__TEST_MockExpectedCall_callWithObjectParameterEqualComparisonButFailsWithoutComparator_Test_00335000
  ;
  return;
}

Assistant:

TEST(MockExpectedCall, callWithObjectParameterEqualComparisonButFailsWithoutComparator)
{
    MockNamedValueComparatorsAndCopiersRepository repository;
    MockNamedValue::setDefaultComparatorsAndCopiersRepository(&repository);

    TypeForTestingExpectedFunctionCall type(1), equalType(1);
    MockNamedValue parameter("name");
    parameter.setConstObjectPointer("type", &equalType);
    call->withParameterOfType("type", "name", &type);
    CHECK(!call->hasInputParameter(parameter));
}